

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O3

bool Memory::
     SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
     ::RescanObjectsOnPage
               (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *block,
               char *pageAddress,char *blockStartAddress,BVStatic<2048UL> *heapBlockMarkBits,
               uint localObjectSize,uint bucketIndex,bool *anyObjectRescanned,Recycler *recycler)

{
  MarkData *pMVar1;
  size_t *psVar2;
  ushort uVar3;
  Recycler *pRVar4;
  code *pcVar5;
  size_t sVar6;
  bool bVar7;
  BOOLEAN BVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined4 *puVar16;
  char *pcVar17;
  uint pageStartBitIndex;
  char *error;
  uint bitIndex;
  BVIndex BVar18;
  long lVar19;
  uint uVar20;
  ulong uVar22;
  MarkCandidate item;
  bool local_34;
  ulong uVar21;
  
  pMVar1 = &(recycler->collectionStats).markData;
  pMVar1->rescanPageCount = pMVar1->rescanPageCount + 8;
  if (heapBlockMarkBits->data[0].word == 0) {
    uVar22 = 0xffffffffffffffff;
    do {
      if (uVar22 == 0x1e) goto LAB_0074b481;
      uVar21 = uVar22 + 1;
      lVar19 = uVar22 + 2;
      uVar22 = uVar21;
    } while (heapBlockMarkBits->data[lVar19].word == 0);
    if (0x1e < uVar21) {
LAB_0074b481:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,100,"(!heapBlockMarkBits->IsAllClear())",
                         "!heapBlockMarkBits->IsAllClear()");
      if (!bVar7) goto LAB_0074bc3e;
      *puVar16 = 0;
    }
  }
  if (anyObjectRescanned != (bool *)0x0) {
    *anyObjectRescanned = false;
  }
  uVar22 = (long)pageAddress - (long)blockStartAddress;
  if (0x7fff < uVar22) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x6b,
                       "((char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize)"
                       ,
                       "(char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize"
                      );
    if (!bVar7) goto LAB_0074bc3e;
    *puVar16 = 0;
  }
  uVar21 = (uVar22 & 0xffffffff) / (ulong)localObjectSize;
  uVar20 = (uint)uVar21;
  pcVar17 = blockStartAddress + uVar20 * localObjectSize;
  if (((ulong)pcVar17 & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                       ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                       "HeapInfo::IsAlignedAddress(objectAddress)");
    if (!bVar7) goto LAB_0074bc3e;
    *puVar16 = 0;
  }
  if (0xfffefff < (uint)uVar22) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x77,"(pageByteOffset / AutoSystemInfo::PageSize < (32767 * 2 + 1))",
                       "pageByteOffset / AutoSystemInfo::PageSize < USHRT_MAX");
    if (!bVar7) goto LAB_0074bc3e;
    *puVar16 = 0;
  }
  uVar10 = HeapInfo::GetMediumBucketIndex((ulong)localObjectSize);
  if (0x1c < uVar10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,400,"(index < TBlockAttributes::BucketCount)",
                       "index < TBlockAttributes::BucketCount");
    if (!bVar7) goto LAB_0074bc3e;
    *puVar16 = 0;
  }
  pageStartBitIndex = (uint)(uVar22 >> 4) & 0xfffffff;
  uVar22 = uVar22 >> 0xc & 0xffff;
  uVar11 = SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::CalculateMarkCountForPage
                     (heapBlockMarkBits,bucketIndex,pageStartBitIndex);
  uVar3 = *(ushort *)((ulong)uVar10 * 0x20 + 0x1609682 + uVar22 * 4);
  uVar12 = (uint)(0x8000 / (ulong)localObjectSize);
  if (uVar12 <= uVar20) {
    ReportFatalException(0,-0x7fffbffb,Fatal_Recycler_MemoryCorruption,3);
  }
  bVar7 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::CanRescanFullBlock();
  if ((bVar7) && (uVar14 = (uint)uVar3, uVar11 == uVar14)) {
    if ((recycler->collectionState).value == CollectionStateParallelMark) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                         ,0x206,"(this->collectionState != CollectionStateParallelMark)",
                         "this->collectionState != CollectionStateParallelMark");
      if (!bVar7) goto LAB_0074bc3e;
      *puVar16 = 0;
    }
    if (pageAddress == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.inl"
                         ,9,"(objectAddress != nullptr)","objectAddress != nullptr");
      if (!bVar7) goto LAB_0074bc3e;
      *puVar16 = 0;
    }
    pRVar4 = (recycler->markContext).recycler;
    if ((pRVar4->forceTraceMark != false) ||
       (bVar7 = Js::Phases::IsEnabled(&pRVar4->recyclerFlagsTable->Trace,MarkPhase), bVar7)) {
      Output::Print(L" %p",pageAddress);
    }
    LOCK();
    psVar2 = &(((recycler->markContext).recycler)->collectionStats).scanCount;
    *(int *)psVar2 = (int)*psVar2 + 1;
    UNLOCK();
    item.byteCount = 0x1000;
    item.obj = (void **)pageAddress;
    bVar7 = PageStack<Memory::MarkContext::MarkCandidate>::Push
                      (&(recycler->markContext).markStack,item);
    if (!bVar7) {
      return false;
    }
    sVar6 = (recycler->collectionStats).markData.rescanObjectByteCount;
    (recycler->collectionStats).markData.rescanObjectCount =
         (ulong)uVar14 + (recycler->collectionStats).markData.rescanObjectCount;
    (recycler->collectionStats).markData.rescanObjectByteCount = uVar11 * localObjectSize + sVar6;
    local_34 = true;
    if (anyObjectRescanned == (bool *)0x0) {
      return true;
    }
    goto LAB_0074bc29;
  }
  BVar18 = (uint)((ulong)pcVar17 >> 4) & 0x7ff;
  if (pcVar17 == pageAddress) {
    bVar7 = true;
  }
  else {
    if (pcVar17 < blockStartAddress || pageAddress <= pcVar17) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x9f,
                         "(startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress)"
                         ,
                         "startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress"
                        );
      if (!bVar7) goto LAB_0074bc3e;
      *puVar16 = 0;
    }
    BVar8 = BVStatic<2048UL>::Test(heapBlockMarkBits,BVar18);
    bVar7 = BVar8 != '\x01';
    uVar11 = uVar11 + (BVar8 == '\x01');
  }
  uVar13 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetObjectBitDeltaForBucketIndex
                     (bucketIndex);
  if (uVar11 == 0) {
    local_34 = false;
  }
  else {
    uVar14 = 0;
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      uVar20 = (uint)uVar21;
      if (uVar12 <= uVar20) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                           ,0xae,"(objectIndex < localObjectCount)","objectIndex < localObjectCount"
                          );
        if (!bVar9) goto LAB_0074bc3e;
        *puVar16 = 0;
      }
      if (0x1c < bucketIndex) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                           ,0x186,"(index < TBlockAttributes::BucketCount)",
                           "index < TBlockAttributes::BucketCount");
        if (!bVar9) goto LAB_0074bc3e;
        *puVar16 = 0;
      }
      BVar8 = BVStatic<2048UL>::Test
                        (HeapInfo::mediumAllocValidPointersMap.invalidBitsBuffers + bucketIndex,
                         BVar18);
      if (BVar8 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                           ,0xaf,
                           "(!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex))"
                           ,
                           "!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex)"
                          );
        if (!bVar9) goto LAB_0074bc3e;
        *puVar16 = 0;
      }
      BVar8 = BVStatic<2048UL>::Test(heapBlockMarkBits,BVar18);
      if (BVar8 != '\0') {
        bVar9 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::RescanObject
                          (&block->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>
                           ,blockStartAddress + uVar20 * localObjectSize,localObjectSize,uVar20,
                           recycler);
        if (!bVar9) {
          return false;
        }
        uVar14 = uVar14 + 1;
      }
      uVar20 = uVar20 + 1;
      uVar21 = (ulong)uVar20;
      BVar18 = BVar18 + uVar13;
    } while (uVar14 < uVar11);
    local_34 = true;
  }
  uVar15 = SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::CalculateMarkCountForPage
                     (heapBlockMarkBits,bucketIndex,pageStartBitIndex);
  if (pcVar17 == pageAddress || bVar7) {
    if (uVar11 != uVar15) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      error = 
      "(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex))"
      ;
      pcVar17 = 
      "rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex)"
      ;
      uVar11 = 0xc5;
LAB_0074bb6c:
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,uVar11,error,pcVar17);
      if (!bVar7) {
LAB_0074bc3e:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar16 = 0;
    }
  }
  else if (uVar11 != uVar15 + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    error = 
    "(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1)"
    ;
    pcVar17 = 
    "rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1"
    ;
    uVar11 = 0xc1;
    goto LAB_0074bb6c;
  }
  lVar19 = (ulong)uVar10 * 0x20 + 0x1609680;
  uVar20 = uVar20 + 1;
  if (uVar20 < *(ushort *)(lVar19 + uVar22 * 4)) {
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    BVar18 = uVar13 * uVar20;
    do {
      BVar8 = BVStatic<2048UL>::Test(heapBlockMarkBits,BVar18);
      if (BVar8 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                           ,0xcd,"(!heapBlockMarkBits->Test(i * objectBitDelta))",
                           "!heapBlockMarkBits->Test(i * objectBitDelta)");
        if (!bVar7) goto LAB_0074bc3e;
        *puVar16 = 0;
      }
      uVar20 = uVar20 + 1;
      BVar18 = BVar18 + uVar13;
    } while (uVar20 < *(ushort *)(lVar19 + uVar22 * 4));
  }
  if (anyObjectRescanned == (bool *)0x0) {
    return true;
  }
LAB_0074bc29:
  *anyObjectRescanned = local_34;
  return true;
}

Assistant:

bool
SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(TBlockType * block, char* pageAddress, char * blockStartAddress, BVStatic<TBlockAttributes::BitVectorCount> * heapBlockMarkBits, const uint localObjectSize, uint bucketIndex, __out_opt bool* anyObjectRescanned, Recycler * recycler)
{
    RECYCLER_STATS_ADD(recycler, markData.rescanPageCount, TBlockAttributes::PageCount);

    // By the time we get here, we should have ensured that there's a mark on any page somewhere.
    // REVIEW: Worth check on just the page's mark bits?
    Assert(!heapBlockMarkBits->IsAllClear());

    if (anyObjectRescanned != nullptr)
    {
        *anyObjectRescanned = false;
    }

    Assert((char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize);
    const uint pageByteOffset = static_cast<uint>((char*)pageAddress - blockStartAddress);
    uint firstObjectOnPageIndex = pageByteOffset / localObjectSize;

    // This is not necessarily the address on the first object that starts on the page
    // If the last object on the previous page spans two pages, this is the address of that object
    // We do it this way so that we can figure out if we need to rescan the first few bytes of the page
    // if the actual first object on this page is not located at the start of the page
    char* const startObjectAddress = blockStartAddress + (firstObjectOnPageIndex * localObjectSize);
    const uint startBitIndex = TBlockType::GetAddressBitIndex(startObjectAddress);
    const uint pageStartBitIndex = pageByteOffset >> HeapConstants::ObjectAllocationShift;

    Assert(pageByteOffset / AutoSystemInfo::PageSize < USHRT_MAX);
    const ushort pageNumber = static_cast<const ushort>(pageByteOffset / AutoSystemInfo::PageSize);
    const typename TBlockType::BlockInfo& blockInfoForPage = HeapInfo::GetBlockInfo<TBlockAttributes>(localObjectSize)[pageNumber];

    bool lastObjectOnPreviousPageMarked = false;
    // Calculate the mark count here since we no longer keep track during marking
    uint rescanMarkCount = TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex);
    const uint pageObjectCount = blockInfoForPage.pageObjectCount;
    const uint localObjectCount = (TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / localObjectSize;

    // With protected unallocatable ending pages and reset writewatch, we should never be scanning on these pages.
    if (firstObjectOnPageIndex >= localObjectCount)
    {
        ReportFatalException(NULL, E_FAIL, Fatal_Recycler_MemoryCorruption, 3);
    }

    // If all objects are marked, rescan whole block at once
    if (TBlockType::CanRescanFullBlock() && rescanMarkCount == pageObjectCount)
    {
        // REVIEW: Can we optimize this more?
        if (!recycler->AddMark(pageAddress, AutoSystemInfo::PageSize))
        {
            // Failed to add to the mark stack due to OOM.
            return false;
        }

        RECYCLER_STATS_ADD(recycler, markData.rescanObjectCount, pageObjectCount);
        RECYCLER_STATS_ADD(recycler, markData.rescanObjectByteCount, localObjectSize * pageObjectCount);
        if (anyObjectRescanned != nullptr)
        {
            *anyObjectRescanned = true;
        }

        return true;
    }

    if (startObjectAddress != pageAddress)
    {
        // If the last object on the previous page that spans into the current page is marked,
        // we need to count that in the markCount for rescan
        Assert(startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress);
        lastObjectOnPreviousPageMarked = (heapBlockMarkBits->Test(startBitIndex) == TRUE);
        if (lastObjectOnPreviousPageMarked)
        {
            rescanMarkCount++;
        }
    }

    const uint objectBitDelta = SmallHeapBlockT<TBlockAttributes>::GetObjectBitDeltaForBucketIndex(bucketIndex);

    uint rescanCount = 0;
    uint objectIndex = firstObjectOnPageIndex;

    for (uint bitIndex = startBitIndex; rescanCount < rescanMarkCount; objectIndex++, bitIndex += objectBitDelta)
    {
        Assert(objectIndex < localObjectCount);
        Assert(!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex));

        if (heapBlockMarkBits->Test(bitIndex))
        {
            char * objectAddress = blockStartAddress + objectIndex * localObjectSize;
            if (!TBlockType::RescanObject(block, objectAddress, localObjectSize, objectIndex, recycler))
            {
                // Failed to add to the mark stack due to OOM.
                return false;
            }

            rescanCount++;
        }
    }

    // Mark bits should not have changed during the Rescan
    if (startObjectAddress != pageAddress && lastObjectOnPreviousPageMarked)
    {
        Assert(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1);
    }
    else
    {
        Assert(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex));
    }

#if DBG
    // We stopped when we hit the rescanMarkCount.
    // Make sure no other objects were marked, otherwise our rescanMarkCount was wrong.
    for (uint i = objectIndex + 1; i < blockInfoForPage.lastObjectIndexOnPage; i++)
    {
        Assert(!heapBlockMarkBits->Test(i * objectBitDelta));
    }
#endif

    // Let the caller know if we rescanned anything on this page
    if (anyObjectRescanned != nullptr)
    {
        (*anyObjectRescanned) = (rescanCount > 0);
    }

    return true;
}